

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<char>_> *
kj::parse::Many_<kj::parse::CharGroup_,_true>::Impl<capnp::compiler::Lexer::ParserInput,_char>::
apply(Maybe<kj::Array<char>_> *__return_storage_ptr__,CharGroup_ *subParser,ParserInput *input)

{
  ArrayDisposer *pAVar1;
  ArrayDisposer *pAVar2;
  char cVar3;
  Maybe<kj::Array<char>_> *pMVar4;
  NullableValue<char> _subResult425;
  ParserInput subInput;
  Results results;
  undefined1 local_94 [12];
  IteratorInput<char,_const_char_*> local_88;
  char *local_68;
  ArrayBuilder<char> local_58;
  
  local_58.ptr = (char *)0x0;
  local_58.pos = (char *)0x0;
  local_58.endPtr = (char *)0x0;
  local_58.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_94._4_8_ = __return_storage_ptr__;
  do {
    pAVar1 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).pos;
    pAVar2 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).end;
    if (pAVar1 == pAVar2) break;
    local_68 = input->begin;
    local_88.parent = &input->super_IteratorInput<char,_const_char_*>;
    local_88.pos = (char *)pAVar1;
    local_88.end = (char *)pAVar2;
    local_88.best = (char *)pAVar1;
    CharGroup_::operator()((CharGroup_ *)local_94,(ParserInput *)subParser);
    cVar3 = local_94[0];
    local_94[2] = local_94[0];
    if (local_94[0] == '\x01') {
      local_94[3] = local_94[1];
      ((IteratorInput<char,_const_char_*> *)&(local_88.parent)->parent)->pos = local_88.pos;
      Vector<char>::add<char>((Vector<char> *)&local_58,local_94 + 3);
    }
    IteratorInput<char,_const_char_*>::~IteratorInput
              ((IteratorInput<char,_const_char_*> *)(local_94 + 0xc));
  } while (cVar3 != '\0');
  if (local_58.pos == local_58.ptr) {
    ((NullableValue<kj::Array<char>_> *)local_94._4_8_)->isSet = false;
    pMVar4 = (Maybe<kj::Array<char>_> *)local_94._4_8_;
  }
  else {
    Vector<char>::releaseAsArray((Array<char> *)(local_94 + 0xc),(Vector<char> *)&local_58);
    pMVar4 = (Maybe<kj::Array<char>_> *)local_94._4_8_;
    ((NullableValue<kj::Array<char>_> *)local_94._4_8_)->isSet = true;
    (((NullableValue<kj::Array<char>_> *)local_94._4_8_)->field_1).value.ptr =
         (char *)local_88.parent;
    (((NullableValue<kj::Array<char>_> *)local_94._4_8_)->field_1).value.size_ =
         (size_t)local_88.pos;
    (((NullableValue<kj::Array<char>_> *)local_94._4_8_)->field_1).value.disposer =
         (ArrayDisposer *)local_88.end;
    local_88.parent = (IteratorInput<char,_const_char_*> *)0x0;
    local_88.pos = (char *)0x0;
    Array<char>::~Array((Array<char> *)(local_94 + 0xc));
  }
  ArrayBuilder<char>::dispose(&local_58);
  return pMVar4;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }